

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::ShaderDerivateTests::init(ShaderDerivateTests *this,EVP_PKEY_CTX *ctx)

{
  SurfaceType SVar1;
  int iVar2;
  deUint32 dVar3;
  Context *pCVar4;
  TestContext *testCtx;
  DataType DVar5;
  undefined8 in_RAX;
  TestNode *pTVar6;
  TestNode *pTVar7;
  TestNode *pTVar8;
  char *pcVar9;
  char *pcVar10;
  ostream *poVar11;
  LinearDerivateCase *pLVar12;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  TextureDerivateCase *this_00;
  DerivateFunc func;
  uint uVar13;
  Precision PVar14;
  ulong uVar15;
  long lVar16;
  char *local_1e0 [4];
  TestNode *local_1c0;
  long local_1b8;
  long local_1b0;
  ostringstream caseName;
  
  uVar15 = 0;
  while (func = (DerivateFunc)uVar15, func != DERIVATE_LAST) {
    pTVar6 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               (char *)((long)&DAT_01868e70 + (long)(int)(&DAT_01868e70)[uVar15]),
               (&PTR_anon_var_dwarf_17a7097_01e416c8)[uVar15]);
    tcu::TestNode::addChild((TestNode *)this,pTVar6);
    pTVar7 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar7,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"constant",
               "Derivate of constant argument");
    tcu::TestNode::addChild(pTVar6,pTVar7);
    for (uVar13 = 1; uVar13 != 5; uVar13 = uVar13 + 1) {
      DVar5 = TYPE_FLOAT;
      if (1 < uVar13) {
        DVar5 = glu::getDataTypeFloatVec(uVar13);
      }
      pTVar8 = (TestNode *)operator_new(0xf8);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      pcVar9 = glu::getDataTypeName(DVar5);
      ConstantDerivateCase::ConstantDerivateCase
                ((ConstantDerivateCase *)pTVar8,pCVar4,pcVar9,
                 glcts::fixed_sample_locations_values + 1,func,DVar5);
      tcu::TestNode::addChild(pTVar7,pTVar8);
    }
    lVar16 = 0;
    while( true ) {
      if (lVar16 == 8) break;
      pTVar7 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 init::s_linearDerivateCases[lVar16].name,
                 init::s_linearDerivateCases[lVar16].description);
      pcVar9 = init::s_linearDerivateCases[lVar16].source;
      tcu::TestNode::addChild(pTVar6,pTVar7);
      for (uVar13 = 1; uVar13 != 5; uVar13 = uVar13 + 1) {
        PVar14 = PRECISION_LOWP;
        while( true ) {
          if (PVar14 == PRECISION_LAST) break;
          DVar5 = TYPE_FLOAT;
          if (1 < uVar13) {
            DVar5 = glu::getDataTypeFloatVec(uVar13);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&caseName);
          if (lVar16 == 0 || PVar14 != PRECISION_LOWP) {
            pcVar10 = glu::getDataTypeName(DVar5);
            poVar11 = std::operator<<((ostream *)&caseName,pcVar10);
            poVar11 = std::operator<<(poVar11,"_");
            pcVar10 = glu::getPrecisionName(PVar14);
            std::operator<<(poVar11,pcVar10);
            pLVar12 = (LinearDerivateCase *)operator_new(0x118);
            pCVar4 = (this->super_TestCaseGroup).m_context;
            std::__cxx11::stringbuf::str();
            LinearDerivateCase::LinearDerivateCase
                      (pLVar12,pCVar4,local_1e0[0],glcts::fixed_sample_locations_values + 1,func,
                       DVar5,PVar14,0x1100,SURFACETYPE_DEFAULT_FRAMEBUFFER,0,pcVar9);
            tcu::TestNode::addChild(pTVar7,(TestNode *)pLVar12);
            std::__cxx11::string::~string((string *)local_1e0);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&caseName);
          PVar14 = PVar14 + PRECISION_MEDIUMP;
        }
      }
      lVar16 = lVar16 + 1;
    }
    for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
      pTVar7 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 init::s_fboConfigs[lVar16].name,"Derivate usage when rendering into FBO");
      SVar1 = init::s_fboConfigs[lVar16].surfaceType;
      iVar2 = init::s_fboConfigs[lVar16].numSamples;
      tcu::TestNode::addChild(pTVar6,pTVar7);
      for (uVar13 = 1; uVar13 != 5; uVar13 = uVar13 + 1) {
        PVar14 = PRECISION_LOWP;
        while( true ) {
          if (PVar14 == PRECISION_LAST) break;
          DVar5 = TYPE_FLOAT;
          if (1 < uVar13) {
            DVar5 = glu::getDataTypeFloatVec(uVar13);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&caseName);
          if (SVar1 == SURFACETYPE_FLOAT_FBO || PVar14 != PRECISION_LOWP) {
            pcVar9 = glu::getDataTypeName(DVar5);
            poVar11 = std::operator<<((ostream *)&caseName,pcVar9);
            poVar11 = std::operator<<(poVar11,"_");
            pcVar9 = glu::getPrecisionName(PVar14);
            std::operator<<(poVar11,pcVar9);
            pLVar12 = (LinearDerivateCase *)operator_new(0x118);
            pCVar4 = (this->super_TestCaseGroup).m_context;
            std::__cxx11::stringbuf::str();
            LinearDerivateCase::LinearDerivateCase
                      (pLVar12,pCVar4,local_1e0[0],glcts::fixed_sample_locations_values + 1,func,
                       DVar5,PVar14,0x1100,SVar1,iVar2,
                       "#version 300 es\nin ${PRECISION} ${DATATYPE} v_coord;\nlayout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\nuniform ${PRECISION} ${DATATYPE} u_scale;\nuniform ${PRECISION} ${DATATYPE} u_bias;\nvoid main (void)\n{\n\t${PRECISION} ${DATATYPE} res = ${FUNC}(v_coord) * u_scale + u_bias;\n\to_color = ${CAST_TO_OUTPUT};\n}\n"
                      );
            tcu::TestNode::addChild(pTVar7,(TestNode *)pLVar12);
            std::__cxx11::string::~string((string *)local_1e0);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&caseName);
          PVar14 = PVar14 + PRECISION_MEDIUMP;
        }
      }
    }
    lVar16 = 0;
    while( true ) {
      pTVar7 = (TestNode *)operator_new(0x70);
      testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
      local_1c0 = pTVar7;
      if (lVar16 == 2) break;
      local_1b8 = lVar16;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,testCtx,init::s_hints[lVar16].name,"Shader derivate hints")
      ;
      dVar3 = init::s_hints[lVar16].hint;
      tcu::TestNode::addChild(pTVar6,pTVar7);
      lVar16 = 0;
      while( true ) {
        if (lVar16 == 3) break;
        pTVar8 = (TestNode *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar8,
                   (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                   init::s_hintFboConfigs[lVar16].name,glcts::fixed_sample_locations_values + 1);
        SVar1 = init::s_hintFboConfigs[lVar16].surfaceType;
        iVar2 = init::s_hintFboConfigs[lVar16].numSamples;
        local_1b0 = lVar16;
        tcu::TestNode::addChild(pTVar7,pTVar8);
        for (uVar13 = 1; uVar13 != 5; uVar13 = uVar13 + 1) {
          PVar14 = PRECISION_LOWP;
          while( true ) {
            if (PVar14 == PRECISION_LAST) break;
            DVar5 = TYPE_FLOAT;
            if (1 < uVar13) {
              DVar5 = glu::getDataTypeFloatVec(uVar13);
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&caseName);
            if (SVar1 == SURFACETYPE_FLOAT_FBO || PVar14 != PRECISION_LOWP) {
              pcVar9 = glu::getDataTypeName(DVar5);
              poVar11 = std::operator<<((ostream *)&caseName,pcVar9);
              poVar11 = std::operator<<(poVar11,"_");
              pcVar9 = glu::getPrecisionName(PVar14);
              std::operator<<(poVar11,pcVar9);
              pLVar12 = (LinearDerivateCase *)operator_new(0x118);
              pCVar4 = (this->super_TestCaseGroup).m_context;
              std::__cxx11::stringbuf::str();
              LinearDerivateCase::LinearDerivateCase
                        (pLVar12,pCVar4,local_1e0[0],glcts::fixed_sample_locations_values + 1,func,
                         DVar5,PVar14,dVar3,SVar1,iVar2,
                         "#version 300 es\nin ${PRECISION} ${DATATYPE} v_coord;\nlayout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\nuniform ${PRECISION} ${DATATYPE} u_scale;\nuniform ${PRECISION} ${DATATYPE} u_bias;\nvoid main (void)\n{\n\t${PRECISION} ${DATATYPE} res = ${FUNC}(v_coord) * u_scale + u_bias;\n\to_color = ${CAST_TO_OUTPUT};\n}\n"
                        );
              tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar12);
              std::__cxx11::string::~string((string *)local_1e0);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&caseName);
            PVar14 = PVar14 + PRECISION_MEDIUMP;
          }
        }
        lVar16 = local_1b0 + 1;
        pTVar7 = local_1c0;
      }
      lVar16 = local_1b8 + 1;
    }
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar7,testCtx,"texture","Derivate of texture lookup result");
    tcu::TestNode::addChild(pTVar6,pTVar7);
    in_RAX = extraout_RAX;
    for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
      pTVar6 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar6,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 init::s_textureConfigs[lVar16].name,glcts::fixed_sample_locations_values + 1);
      SVar1 = init::s_textureConfigs[lVar16].surfaceType;
      iVar2 = init::s_textureConfigs[lVar16].numSamples;
      dVar3 = init::s_textureConfigs[lVar16].hint;
      tcu::TestNode::addChild(pTVar7,pTVar6);
      in_RAX = extraout_RAX_00;
      for (uVar13 = 1; uVar13 != 5; uVar13 = uVar13 + 1) {
        PVar14 = PRECISION_LOWP;
        while( true ) {
          if (PVar14 == PRECISION_LAST) break;
          DVar5 = TYPE_FLOAT;
          if (1 < uVar13) {
            DVar5 = glu::getDataTypeFloatVec(uVar13);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&caseName);
          if (SVar1 == SURFACETYPE_FLOAT_FBO || PVar14 != PRECISION_LOWP) {
            pcVar9 = glu::getDataTypeName(DVar5);
            poVar11 = std::operator<<((ostream *)&caseName,pcVar9);
            poVar11 = std::operator<<(poVar11,"_");
            pcVar9 = glu::getPrecisionName(PVar14);
            std::operator<<(poVar11,pcVar9);
            this_00 = (TextureDerivateCase *)operator_new(0x120);
            pCVar4 = (this->super_TestCaseGroup).m_context;
            std::__cxx11::stringbuf::str();
            TextureDerivateCase::TextureDerivateCase
                      (this_00,pCVar4,local_1e0[0],glcts::fixed_sample_locations_values + 1,func,
                       DVar5,PVar14,dVar3,SVar1,iVar2);
            tcu::TestNode::addChild(pTVar6,(TestNode *)this_00);
            std::__cxx11::string::~string((string *)local_1e0);
          }
          in_RAX = std::__cxx11::ostringstream::~ostringstream((ostringstream *)&caseName);
          PVar14 = PVar14 + PRECISION_MEDIUMP;
        }
      }
      pTVar7 = local_1c0;
    }
    uVar15 = (ulong)(func + DERIVATE_DFDY);
  }
  return (int)in_RAX;
}

Assistant:

void ShaderDerivateTests::init (void)
{
	static const struct
	{
		const char*		name;
		const char*		description;
		const char*		source;
	} s_linearDerivateCases[] =
	{
		{
			"linear",
			"Basic derivate of linearly interpolated argument",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res = ${FUNC}(v_coord) * u_scale + u_bias;\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
		{
			"in_function",
			"Derivate of linear function argument",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"\n"
			"${PRECISION} ${DATATYPE} computeRes (${PRECISION} ${DATATYPE} value)\n"
			"{\n"
			"	return ${FUNC}(v_coord) * u_scale + u_bias;\n"
			"}\n"
			"\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res = computeRes(v_coord);\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
		{
			"static_if",
			"Derivate of linearly interpolated value in static if",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res;\n"
			"	if (false)\n"
			"		res = ${FUNC}(-v_coord) * u_scale + u_bias;\n"
			"	else\n"
			"		res = ${FUNC}(v_coord) * u_scale + u_bias;\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
		{
			"static_loop",
			"Derivate of linearly interpolated value in static loop",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res = ${DATATYPE}(0.0);\n"
			"	for (int i = 0; i < 2; i++)\n"
			"		res += ${FUNC}(v_coord * float(i));\n"
			"	res = res * u_scale + u_bias;\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
		{
			"static_switch",
			"Derivate of linearly interpolated value in static switch",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res;\n"
			"	switch (1)\n"
			"	{\n"
			"		case 0:	res = ${FUNC}(-v_coord) * u_scale + u_bias;	break;\n"
			"		case 1:	res = ${FUNC}(v_coord) * u_scale + u_bias;	break;\n"
			"	}\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
		{
			"uniform_if",
			"Derivate of linearly interpolated value in uniform if",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"uniform bool ub_true;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res;\n"
			"	if (ub_true)"
			"		res = ${FUNC}(v_coord) * u_scale + u_bias;\n"
			"	else\n"
			"		res = ${FUNC}(-v_coord) * u_scale + u_bias;\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
		{
			"uniform_loop",
			"Derivate of linearly interpolated value in uniform loop",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"uniform int ui_two;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res = ${DATATYPE}(0.0);\n"
			"	for (int i = 0; i < ui_two; i++)\n"
			"		res += ${FUNC}(v_coord * float(i));\n"
			"	res = res * u_scale + u_bias;\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
		{
			"uniform_switch",
			"Derivate of linearly interpolated value in uniform switch",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"uniform int ui_one;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res;\n"
			"	switch (ui_one)\n"
			"	{\n"
			"		case 0:	res = ${FUNC}(-v_coord) * u_scale + u_bias;	break;\n"
			"		case 1:	res = ${FUNC}(v_coord) * u_scale + u_bias;	break;\n"
			"	}\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
	};

	static const struct
	{
		const char*		name;
		SurfaceType		surfaceType;
		int				numSamples;
	} s_fboConfigs[] =
	{
		{ "fbo",		SURFACETYPE_DEFAULT_FRAMEBUFFER,	0 },
		{ "fbo_msaa2",	SURFACETYPE_UNORM_FBO,				2 },
		{ "fbo_msaa4",	SURFACETYPE_UNORM_FBO,				4 },
		{ "fbo_float",	SURFACETYPE_FLOAT_FBO,				0 },
	};

	static const struct
	{
		const char*		name;
		deUint32		hint;
	} s_hints[] =
	{
		{ "fastest",	GL_FASTEST	},
		{ "nicest",		GL_NICEST	},
	};

	static const struct
	{
		const char*		name;
		SurfaceType		surfaceType;
		int				numSamples;
	} s_hintFboConfigs[] =
	{
		{ "default",		SURFACETYPE_DEFAULT_FRAMEBUFFER,	0 },
		{ "fbo_msaa4",		SURFACETYPE_UNORM_FBO,				4 },
		{ "fbo_float",		SURFACETYPE_FLOAT_FBO,				0 }
	};

	static const struct
	{
		const char*		name;
		SurfaceType		surfaceType;
		int				numSamples;
		deUint32		hint;
	} s_textureConfigs[] =
	{
		{ "basic",			SURFACETYPE_DEFAULT_FRAMEBUFFER,	0,	GL_DONT_CARE	},
		{ "msaa4",			SURFACETYPE_UNORM_FBO,				4,	GL_DONT_CARE	},
		{ "float_fastest",	SURFACETYPE_FLOAT_FBO,				0,	GL_FASTEST		},
		{ "float_nicest",	SURFACETYPE_FLOAT_FBO,				0,	GL_NICEST		},
	};

	// .dfdx, .dfdy, .fwidth
	for (int funcNdx = 0; funcNdx < DERIVATE_LAST; funcNdx++)
	{
		const DerivateFunc			function		= DerivateFunc(funcNdx);
		tcu::TestCaseGroup* const	functionGroup	= new tcu::TestCaseGroup(m_testCtx, getDerivateFuncCaseName(function), getDerivateFuncName(function));
		addChild(functionGroup);

		// .constant - no precision variants, checks that derivate of constant arguments is 0
		{
			tcu::TestCaseGroup* const constantGroup = new tcu::TestCaseGroup(m_testCtx, "constant", "Derivate of constant argument");
			functionGroup->addChild(constantGroup);

			for (int vecSize = 1; vecSize <= 4; vecSize++)
			{
				const glu::DataType dataType = vecSize > 1 ? glu::getDataTypeFloatVec(vecSize) : glu::TYPE_FLOAT;
				constantGroup->addChild(new ConstantDerivateCase(m_context, glu::getDataTypeName(dataType), "", function, dataType));
			}
		}

		// Cases based on LinearDerivateCase
		for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(s_linearDerivateCases); caseNdx++)
		{
			tcu::TestCaseGroup* const linearCaseGroup	= new tcu::TestCaseGroup(m_testCtx, s_linearDerivateCases[caseNdx].name, s_linearDerivateCases[caseNdx].description);
			const char*			source					= s_linearDerivateCases[caseNdx].source;
			functionGroup->addChild(linearCaseGroup);

			for (int vecSize = 1; vecSize <= 4; vecSize++)
			{
				for (int precNdx = 0; precNdx < glu::PRECISION_LAST; precNdx++)
				{
					const glu::DataType		dataType		= vecSize > 1 ? glu::getDataTypeFloatVec(vecSize) : glu::TYPE_FLOAT;
					const glu::Precision	precision		= glu::Precision(precNdx);
					const SurfaceType		surfaceType		= SURFACETYPE_DEFAULT_FRAMEBUFFER;
					const int				numSamples		= 0;
					const deUint32			hint			= GL_DONT_CARE;
					ostringstream			caseName;

					if (caseNdx != 0 && precision == glu::PRECISION_LOWP)
						continue; // Skip as lowp doesn't actually produce any bits when rendered to default FB.

					caseName << glu::getDataTypeName(dataType) << "_" << glu::getPrecisionName(precision);

					linearCaseGroup->addChild(new LinearDerivateCase(m_context, caseName.str().c_str(), "", function, dataType, precision, hint, surfaceType, numSamples, source));
				}
			}
		}

		// Fbo cases
		for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(s_fboConfigs); caseNdx++)
		{
			tcu::TestCaseGroup*	const	fboGroup		= new tcu::TestCaseGroup(m_testCtx, s_fboConfigs[caseNdx].name, "Derivate usage when rendering into FBO");
			const char*					source			= s_linearDerivateCases[0].source; // use source from .linear group
			const SurfaceType			surfaceType		= s_fboConfigs[caseNdx].surfaceType;
			const int					numSamples		= s_fboConfigs[caseNdx].numSamples;
			functionGroup->addChild(fboGroup);

			for (int vecSize = 1; vecSize <= 4; vecSize++)
			{
				for (int precNdx = 0; precNdx < glu::PRECISION_LAST; precNdx++)
				{
					const glu::DataType		dataType		= vecSize > 1 ? glu::getDataTypeFloatVec(vecSize) : glu::TYPE_FLOAT;
					const glu::Precision	precision		= glu::Precision(precNdx);
					const deUint32			hint			= GL_DONT_CARE;
					ostringstream			caseName;

					if (surfaceType != SURFACETYPE_FLOAT_FBO && precision == glu::PRECISION_LOWP)
						continue; // Skip as lowp doesn't actually produce any bits when rendered to U8 RT.

					caseName << glu::getDataTypeName(dataType) << "_" << glu::getPrecisionName(precision);

					fboGroup->addChild(new LinearDerivateCase(m_context, caseName.str().c_str(), "", function, dataType, precision, hint, surfaceType, numSamples, source));
				}
			}
		}

		// .fastest, .nicest
		for (int hintCaseNdx = 0; hintCaseNdx < DE_LENGTH_OF_ARRAY(s_hints); hintCaseNdx++)
		{
			tcu::TestCaseGroup* const	hintGroup		= new tcu::TestCaseGroup(m_testCtx, s_hints[hintCaseNdx].name, "Shader derivate hints");
			const char*					source			= s_linearDerivateCases[0].source; // use source from .linear group
			const deUint32				hint			= s_hints[hintCaseNdx].hint;
			functionGroup->addChild(hintGroup);

			for (int fboCaseNdx = 0; fboCaseNdx < DE_LENGTH_OF_ARRAY(s_hintFboConfigs); fboCaseNdx++)
			{
				tcu::TestCaseGroup*	const	fboGroup		= new tcu::TestCaseGroup(m_testCtx, s_hintFboConfigs[fboCaseNdx].name, "");
				const SurfaceType			surfaceType		= s_hintFboConfigs[fboCaseNdx].surfaceType;
				const int					numSamples		= s_hintFboConfigs[fboCaseNdx].numSamples;
				hintGroup->addChild(fboGroup);

				for (int vecSize = 1; vecSize <= 4; vecSize++)
				{
					for (int precNdx = 0; precNdx < glu::PRECISION_LAST; precNdx++)
					{
						const glu::DataType		dataType		= vecSize > 1 ? glu::getDataTypeFloatVec(vecSize) : glu::TYPE_FLOAT;
						const glu::Precision	precision		= glu::Precision(precNdx);
						ostringstream			caseName;

						if (surfaceType != SURFACETYPE_FLOAT_FBO && precision == glu::PRECISION_LOWP)
							continue; // Skip as lowp doesn't actually produce any bits when rendered to U8 RT.

						caseName << glu::getDataTypeName(dataType) << "_" << glu::getPrecisionName(precision);

						fboGroup->addChild(new LinearDerivateCase(m_context, caseName.str().c_str(), "", function, dataType, precision, hint, surfaceType, numSamples, source));
					}
				}
			}
		}

		// .texture
		{
			tcu::TestCaseGroup* const textureGroup = new tcu::TestCaseGroup(m_testCtx, "texture", "Derivate of texture lookup result");
			functionGroup->addChild(textureGroup);

			for (int texCaseNdx = 0; texCaseNdx < DE_LENGTH_OF_ARRAY(s_textureConfigs); texCaseNdx++)
			{
				tcu::TestCaseGroup*	const	caseGroup		= new tcu::TestCaseGroup(m_testCtx, s_textureConfigs[texCaseNdx].name, "");
				const SurfaceType			surfaceType		= s_textureConfigs[texCaseNdx].surfaceType;
				const int					numSamples		= s_textureConfigs[texCaseNdx].numSamples;
				const deUint32				hint			= s_textureConfigs[texCaseNdx].hint;
				textureGroup->addChild(caseGroup);

				for (int vecSize = 1; vecSize <= 4; vecSize++)
				{
					for (int precNdx = 0; precNdx < glu::PRECISION_LAST; precNdx++)
					{
						const glu::DataType		dataType		= vecSize > 1 ? glu::getDataTypeFloatVec(vecSize) : glu::TYPE_FLOAT;
						const glu::Precision	precision		= glu::Precision(precNdx);
						ostringstream			caseName;

						if (surfaceType != SURFACETYPE_FLOAT_FBO && precision == glu::PRECISION_LOWP)
							continue; // Skip as lowp doesn't actually produce any bits when rendered to U8 RT.

						caseName << glu::getDataTypeName(dataType) << "_" << glu::getPrecisionName(precision);

						caseGroup->addChild(new TextureDerivateCase(m_context, caseName.str().c_str(), "", function, dataType, precision, hint, surfaceType, numSamples));
					}
				}
			}
		}
	}
}